

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UaPdu.cpp
# Opt level: O1

void __thiscall DIS::UaPdu::marshal(UaPdu *this,DataStream *dataStream)

{
  pointer pVVar1;
  ulong uVar2;
  long lVar3;
  Vector3Float x;
  Vector3Float local_48;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::marshal(&this->_eventID,dataStream);
  DataStream::operator<<(dataStream,this->_stateChangeIndicator);
  DataStream::operator<<(dataStream,this->_pad);
  DataStream::operator<<(dataStream,this->_passiveParameterIndex);
  DataStream::operator<<(dataStream,this->_propulsionPlantConfiguration);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_shaftRPMs).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_shaftRPMs).
                                   super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_apaData).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_apaData).
                                   super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_emitterSystems).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_emitterSystems).
                                   super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  pVVar1 = (this->_shaftRPMs).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_shaftRPMs).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_48._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_48._z = *(float *)((long)&pVVar1->_x + lVar3);
      local_48._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
      Vector3Float::marshal(&local_48,dataStream);
      Vector3Float::~Vector3Float(&local_48);
      uVar2 = uVar2 + 1;
      pVVar1 = (this->_shaftRPMs).
               super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < (ulong)(((long)(this->_shaftRPMs).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3)
                            * -0x5555555555555555));
  }
  pVVar1 = (this->_apaData).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_apaData).super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_48._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_48._z = *(float *)((long)&pVVar1->_x + lVar3);
      local_48._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
      Vector3Float::marshal(&local_48,dataStream);
      Vector3Float::~Vector3Float(&local_48);
      uVar2 = uVar2 + 1;
      pVVar1 = (this->_apaData).
               super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < (ulong)(((long)(this->_apaData).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3)
                            * -0x5555555555555555));
  }
  pVVar1 = (this->_emitterSystems).
           super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_emitterSystems).
      super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_48._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_48._z = *(float *)((long)&pVVar1->_x + lVar3);
      local_48._8_8_ = *(undefined8 *)((long)&pVVar1->_vptr_Vector3Float + lVar3);
      Vector3Float::marshal(&local_48,dataStream);
      Vector3Float::~Vector3Float(&local_48);
      uVar2 = uVar2 + 1;
      pVVar1 = (this->_emitterSystems).
               super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < (ulong)(((long)(this->_emitterSystems).
                                    super__Vector_base<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void UaPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _emittingEntityID.marshal(dataStream);
    _eventID.marshal(dataStream);
    dataStream << _stateChangeIndicator;
    dataStream << _pad;
    dataStream << _passiveParameterIndex;
    dataStream << _propulsionPlantConfiguration;
    dataStream << ( unsigned char )_shaftRPMs.size();
    dataStream << ( unsigned char )_apaData.size();
    dataStream << ( unsigned char )_emitterSystems.size();

     for(size_t idx = 0; idx < _shaftRPMs.size(); idx++)
     {
        Vector3Float x = _shaftRPMs[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _apaData.size(); idx++)
     {
        Vector3Float x = _apaData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _emitterSystems.size(); idx++)
     {
        Vector3Float x = _emitterSystems[idx];
        x.marshal(dataStream);
     }

}